

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affix.c
# Opt level: O3

err_t affixPrint(int argc,char **argv)

{
  char *name;
  err_t eVar1;
  int iVar2;
  err_t eVar3;
  ulong in_RAX;
  size_t sVar4;
  char *__format;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  size_t count;
  ulong local_38;
  
  eVar1 = 0x25b;
  if (0xfffffffd < argc - 3U) {
    local_38 = in_RAX;
    if (argc == 2) {
      pcVar7 = *argv;
      sVar4 = strLen(pcVar7);
      if (sVar4 == 0) {
        return 0x25b;
      }
      if (*pcVar7 != '-') {
        return 0x25b;
      }
      pcVar7 = pcVar7 + 1;
      argv = argv + 1;
    }
    else {
      pcVar7 = (char *)0x0;
    }
    eVar1 = cmdFileValExist(1,argv);
    if (eVar1 == 0) {
      name = *argv;
      if (pcVar7 == (char *)0x0) {
        puts("prefixes");
        uVar8 = 0;
        eVar1 = cmdFilePrefixRead((octet *)0x0,&local_38,name,0);
        pcVar7 = "  count:  %u\n";
        if (eVar1 == 0) {
          uVar8 = 0;
          sVar4 = 0;
          do {
            pcVar7 = "+%u";
            if (uVar8 == 0) {
              pcVar7 = "  length: %u";
            }
            printf(pcVar7,local_38 & 0xffffffff);
            sVar4 = sVar4 + local_38;
            uVar8 = uVar8 + 1;
            eVar1 = cmdFilePrefixRead((octet *)0x0,&local_38,name,sVar4);
          } while (eVar1 == 0);
          pcVar7 = "\n  count:  %u\n";
          if (uVar8 == 0) {
            pcVar7 = "  count:  %u\n";
          }
        }
        __format = "  count:  %u\n";
        eVar1 = 0;
        printf(pcVar7,uVar8 & 0xffffffff);
        puts("suffixes");
        eVar3 = cmdFileSuffixRead((octet *)0x0,&local_38,name,0);
        uVar5 = 0;
        if (eVar3 == 0) {
          uVar5 = 0;
          sVar4 = 0;
          do {
            pcVar7 = "+%u";
            if (uVar5 == 0) {
              pcVar7 = "  length: %u";
            }
            printf(pcVar7,local_38 & 0xffffffff);
            sVar4 = sVar4 + local_38;
            uVar5 = uVar5 + 1;
            eVar3 = cmdFileSuffixRead((octet *)0x0,&local_38,name,sVar4);
          } while (eVar3 == 0);
          __format = "\n  count:  %u\n";
          if (uVar5 == 0) {
            __format = "  count:  %u\n";
          }
        }
        printf(__format,uVar5 & 0xffffffff);
        if (uVar8 != 0 || uVar5 != 0) {
          puts("\\warning false positives are possible");
        }
      }
      else {
        iVar2 = strCmp(pcVar7,"pc");
        if (iVar2 == 0) {
          eVar1 = cmdFilePrefixRead((octet *)0x0,&local_38,name,0);
          uVar6 = 0;
          if (eVar1 == 0) {
            sVar4 = 0;
            do {
              sVar4 = sVar4 + local_38;
              uVar6 = uVar6 + 1;
              eVar1 = cmdFilePrefixRead((octet *)0x0,&local_38,name,sVar4);
            } while (eVar1 == 0);
          }
        }
        else {
          iVar2 = strCmp(pcVar7,"sc");
          if (iVar2 != 0) {
            return 0x25b;
          }
          eVar1 = cmdFileSuffixRead((octet *)0x0,&local_38,name,0);
          uVar6 = 0;
          if (eVar1 == 0) {
            uVar6 = 0;
            sVar4 = 0;
            do {
              sVar4 = sVar4 + local_38;
              uVar6 = uVar6 + 1;
              eVar1 = cmdFileSuffixRead((octet *)0x0,&local_38,name,sVar4);
            } while (eVar1 == 0);
          }
        }
        eVar1 = 0;
        printf("%u\n",(ulong)uVar6);
      }
    }
  }
  return eVar1;
}

Assistant:

static err_t affixPrint(int argc, char* argv[])
{
	err_t code;
	const char* scope = 0;
	// обработать опции
	if (argc < 1 || argc > 2)
		return ERR_CMD_PARAMS;
	if (argc == 2)
	{
		scope = argv[0];
		if (strLen(scope) < 1 || scope[0] != '-')
			return ERR_CMD_PARAMS;
		++scope, --argc, ++argv;
	}
	// проверить наличие файла
	code = cmdFileValExist(1, argv);
	ERR_CALL_CHECK(code);
	// печатать
	return cmdAffixPrint(argv[0], scope);
}